

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_lextree.c
# Opt level: O3

void fsg_psubtree_dump_node(fsg_lextree_t *tree,fsg_pnode_t *node,FILE *fp)

{
  fsg_link_t *pfVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = 0xffffffff;
  do {
    fwrite("  ",2,1,(FILE *)fp);
    uVar3 = uVar3 + 1;
  } while (uVar3 < node->ppos);
  fprintf((FILE *)fp,"%p.@",node);
  fprintf((FILE *)fp," %5d.SS",(ulong)(node->hmm).ssid);
  fprintf((FILE *)fp," %10d.LP",(ulong)(uint)node->logs2prob);
  fprintf((FILE *)fp," %p.SIB",node->sibling);
  pcVar2 = bin_mdef_ciphone_str(tree->mdef,(uint)node->ci_ext);
  fprintf((FILE *)fp," %s.%d",pcVar2,(ulong)node->ppos);
  if ((node->ppos == '\0') || (node->leaf != '\0')) {
    fwrite(" [",2,1,(FILE *)fp);
    lVar4 = 7;
    do {
      fprintf((FILE *)fp,"%08x",(ulong)(node->ctxt).bv[lVar4 + -7]);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xb);
    fputc(0x5d,(FILE *)fp);
    if (node->leaf != '\0') {
      pfVar1 = (node->next).fsglink;
      if ((long)pfVar1->wid == -1) {
        pcVar2 = "(NULL)";
      }
      else {
        pcVar2 = tree->fsg->vocab[pfVar1->wid];
      }
      fprintf((FILE *)fp," {%s[%d->%d](%d)}",pcVar2,(ulong)(uint)pfVar1->from_state,
              (ulong)(uint)pfVar1->to_state,(ulong)(uint)pfVar1->logs2prob);
      goto LAB_00147bf4;
    }
  }
  fprintf((FILE *)fp," %p.NXT",(node->next).succ);
LAB_00147bf4:
  fputc(10,(FILE *)fp);
  return;
}

Assistant:

void fsg_psubtree_dump_node(fsg_lextree_t *tree, fsg_pnode_t *node, FILE *fp)
{    
    int32 i;
    fsg_link_t *tl;

    /* Indentation */
    for (i = 0; i <= node->ppos; i++)
        fprintf(fp, "  ");

    fprintf(fp, "%p.@", node);    /* Pointer used as node
                    		   * ID */
    fprintf(fp, " %5d.SS", hmm_nonmpx_ssid(&node->hmm));
    fprintf(fp, " %10d.LP", node->logs2prob);
    fprintf(fp, " %p.SIB", node->sibling);
    fprintf(fp, " %s.%d", bin_mdef_ciphone_str(tree->mdef, node->ci_ext), node->ppos);
    if ((node->ppos == 0) || node->leaf) {
        fprintf(fp, " [");
        for (i = 0; i < FSG_PNODE_CTXT_BVSZ; i++)
            fprintf(fp, "%08x", node->ctxt.bv[i]);
        fprintf(fp, "]");
    }
    if (node->leaf) {
        tl = node->next.fsglink;
        fprintf(fp, " {%s[%d->%d](%d)}",
                fsg_model_word_str(tree->fsg, tl->wid),
                tl->from_state, tl->to_state, tl->logs2prob);
    } else {
        fprintf(fp, " %p.NXT", node->next.succ);
    }
    fprintf(fp, "\n");

    return;
}